

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O3

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>
::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,_1,_0,__1,_1> *workspace)

{
  double *pdVar1;
  void *__s;
  double *pdVar2;
  Index nbRows;
  long lVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  *pHVar6;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar7;
  double *pdVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long local_b0;
  double *local_a0;
  ulong local_98;
  ulong local_90;
  Matrix<double,__1,__1,_0,__1,__1> *local_88;
  long local_80;
  double *local_78;
  double *local_70;
  HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  *local_68;
  Matrix<double,__1,__1,_0,__1,__1> *local_60;
  EssentialVectorType local_58;
  
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             *(Index *)(*(long *)this + 8));
  auVar5 = _DAT_00133420;
  pdVar2 = *(double **)(this + 0x18);
  pdVar8 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  if ((pdVar8 == (double *)0x0) || (pdVar8 != (double *)**(undefined8 **)this)) {
    nbRows = (*(undefined8 **)this)[1];
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst,nbRows,nbRows);
    if (0 < (long)pdVar2) {
      uVar17 = (long)pdVar2 + 1;
      lVar10 = -(long)pdVar2;
      lVar16 = (long)pdVar2 * 8;
      do {
        lVar16 = lVar16 + -8;
        lVar10 = lVar10 + 1;
        lVar12 = *(long *)(*(long *)this + 8);
        lVar3 = *(long *)(this + 0x20);
        local_98 = (lVar12 - lVar3) + lVar10;
        local_90 = local_98;
        if (this[0x10] ==
            (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
             )0x1) {
          lVar15 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                   .m_rows;
          lVar13 = (lVar3 + lVar15) - lVar12;
          uVar11 = (((lVar3 + (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              ).m_storage.m_cols) - lVar12) + uVar17) - 2;
          local_a0 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + uVar11 * lVar15 + uVar17 + lVar13 + -2;
          if (((long)local_98 < 0) && (local_a0 != (double *)0x0)) goto LAB_001297a3;
          local_88 = dst;
          local_80 = lVar15;
          if ((long)((lVar13 + uVar17) - 2 | local_98 | uVar11) < 0) goto LAB_0012978c;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_58,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,uVar17 - 2);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_a0,&local_58,(Scalar *)(**(long **)(this + 8) + lVar16),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        else {
          lVar15 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                   .m_rows;
          lVar13 = (lVar3 + lVar15) - lVar12;
          uVar11 = (((lVar3 + (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              ).m_storage.m_cols) - lVar12) + uVar17) - 2;
          local_a0 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + uVar11 * lVar15 + uVar17 + lVar13 + -2;
          if (((long)local_98 < 0) && (local_a0 != (double *)0x0)) goto LAB_001297a3;
          local_88 = dst;
          local_80 = lVar15;
          if ((long)((lVar13 + uVar17) - 2 | local_98 | uVar11) < 0) goto LAB_0012978c;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_58,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,uVar17 - 2);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_a0,&local_58,(Scalar *)(**(long **)(this + 8) + lVar16),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        uVar17 = uVar17 - 1;
      } while (1 < uVar17);
    }
  }
  else {
    lVar16 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows;
    lVar10 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
    if (lVar16 <= lVar10) {
      lVar10 = lVar16;
    }
    if (lVar10 < 0) {
      pcVar9 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>]"
      ;
      goto LAB_001297f1;
    }
    if (lVar10 != 0) {
      lVar12 = lVar10 + -1;
      auVar19._8_4_ = (int)lVar12;
      auVar19._0_8_ = lVar12;
      auVar19._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar17 = 0;
      auVar19 = auVar19 ^ _DAT_00133420;
      auVar20 = _DAT_00133410;
      do {
        auVar21 = auVar20 ^ auVar5;
        if ((bool)(~(auVar21._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar21._0_4_ ||
                    auVar19._4_4_ < auVar21._4_4_) & 1)) {
          *pdVar8 = 1.0;
        }
        if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
            auVar21._12_4_ <= auVar19._12_4_) {
          pdVar8[lVar16 + 1] = 1.0;
        }
        uVar17 = uVar17 + 2;
        lVar12 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 2;
        auVar20._8_8_ = lVar12 + 2;
        pdVar8 = pdVar8 + lVar16 * 2 + 2;
      } while ((lVar10 + 1U & 0xfffffffffffffffe) != uVar17);
    }
    local_a0 = (double *)0x0;
    local_58.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>.
    m_data = (PointerType)dst;
    TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>::setConstant
              ((TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *)&local_58,
               (Scalar *)&local_a0);
    local_68 = (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                *)this;
    local_60 = dst;
    if (0 < (long)pdVar2) {
      lVar16 = (long)pdVar2 * 8;
      lVar10 = -(long)pdVar2;
      pdVar8 = pdVar2;
      do {
        pMVar7 = local_60;
        pHVar6 = local_68;
        lVar16 = lVar16 + -8;
        pdVar1 = (double *)((long)pdVar8 + -1);
        lVar12 = (local_68->m_vectors->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
        lVar3 = local_68->m_shift;
        local_98 = (lVar12 - lVar3) + lVar10 + 1;
        local_90 = local_98;
        if (local_68->m_trans == true) {
          lVar15 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
          lVar13 = (lVar3 + lVar15) - lVar12;
          uVar17 = (long)pdVar8 +
                   ((lVar3 + (local_60->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_cols) - lVar12) + -1;
          local_a0 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + (long)pdVar8 + uVar17 * lVar15 + lVar13 + -1;
          if (((long)local_98 < 0) && (local_a0 != (double *)0x0)) goto LAB_001297a3;
          local_88 = local_60;
          local_80 = lVar15;
          if ((long)((long)pdVar8 + lVar13 + -1 | local_98 | uVar17) < 0) goto LAB_0012978c;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_58,local_68,(Index)pdVar1);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_a0,&local_58,
                     (Scalar *)
                     ((long)(pHVar6->m_coeffs->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_data + lVar16),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        else {
          lVar15 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
          lVar13 = (lVar3 + lVar15) - lVar12;
          uVar17 = (long)pdVar8 +
                   ((lVar3 + (local_60->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_cols) - lVar12) + -1;
          local_a0 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + (long)pdVar8 + uVar17 * lVar15 + lVar13 + -1;
          if (((long)local_98 < 0) && (local_a0 != (double *)0x0)) goto LAB_001297a3;
          local_88 = local_60;
          local_80 = lVar15;
          if ((long)((long)pdVar8 + lVar13 + -1 | local_98 | uVar17) < 0) goto LAB_0012978c;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_58,local_68,(Index)pdVar1);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_a0,&local_58,
                     (Scalar *)
                     ((long)(pHVar6->m_coeffs->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_data + lVar16),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        pdVar4 = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        lVar12 = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows;
        if ((lVar12 < 0) && (pdVar4 + lVar12 * (long)pdVar1 != (double *)0x0)) goto LAB_00129831;
        local_70 = pdVar1;
        if ((pMVar7->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols < (long)pdVar8) goto LAB_001297bd;
        lVar3 = (pHVar6->m_vectors->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                ).m_storage.m_rows;
        uVar11 = (long)pdVar8 + (lVar12 - lVar3);
        uVar17 = lVar10 + lVar3;
        pdVar8 = pdVar4 + lVar12 * (long)pdVar1 + uVar11;
        if (((long)uVar17 < 0) && (pdVar8 != (double *)0x0)) goto LAB_0012981a;
        if ((long)(uVar11 | uVar17) < 0) goto LAB_001297fb;
        if ((long)uVar17 < 0) goto LAB_001297dc;
        uVar14 = (ulong)((uint)((ulong)pdVar8 >> 3) & 1);
        if (uVar17 <= uVar14) {
          uVar14 = uVar17;
        }
        if (((ulong)pdVar8 & 7) != 0) {
          uVar14 = uVar17;
        }
        local_78 = pdVar4;
        if (uVar14 != 0) {
          memset(pdVar8,0,uVar14 * 8);
        }
        lVar13 = lVar10 + (lVar3 - uVar14);
        uVar18 = lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffe;
        lVar15 = uVar18 + uVar14;
        if (1 < lVar13) {
          __s = (void *)((long)local_78 + uVar11 * 8 + uVar14 * 8 + lVar12 * lVar16);
          lVar12 = uVar14 + 2;
          if ((long)(uVar14 + 2) < lVar15) {
            lVar12 = lVar15;
          }
          local_78 = pdVar8;
          memset(__s,0,(~uVar14 + lVar12 & 0xfffffffffffffffe) * 8 + 0x10);
          pdVar8 = local_78;
        }
        local_78 = pdVar8;
        if (lVar15 < (long)uVar17) {
          memset(local_78 + (lVar13 / 2) * 2 + uVar14,0,(((lVar3 - uVar14) - uVar18) + lVar10) * 8);
        }
        lVar10 = lVar10 + 1;
        pdVar8 = local_70;
      } while (local_70 != (double *)0x0);
    }
    lVar16 = (local_68->m_vectors->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
             .m_storage.m_rows;
    if ((long)pdVar2 < lVar16) {
      lVar10 = -1;
      local_b0 = 0;
      lVar12 = 0;
      do {
        pdVar1 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        lVar3 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        pdVar8 = pdVar1 + lVar3 * lVar12;
        if (lVar3 < 0 && pdVar8 != (double *)0x0) goto LAB_00129831;
        if ((local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar12) {
LAB_001297bd:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                        ,0x76,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                       );
        }
        uVar17 = lVar16 + lVar10;
        pdVar8 = pdVar8 + lVar12 + (lVar3 - lVar16) + 1;
        if (((long)uVar17 < 0) && (pdVar8 != (double *)0x0)) goto LAB_0012981a;
        uVar11 = (lVar3 - lVar16) + lVar12 + 1;
        if ((long)(uVar11 | uVar17) < 0) goto LAB_001297fb;
        if ((long)uVar17 < 0) goto LAB_001297dc;
        uVar14 = (ulong)((uint)((ulong)pdVar8 >> 3) & 1);
        if (uVar17 <= uVar14) {
          uVar14 = uVar17;
        }
        if (((ulong)pdVar8 & 7) != 0) {
          uVar14 = uVar17;
        }
        if (uVar14 != 0) {
          memset(pdVar8,0,uVar14 * 8);
        }
        lVar16 = uVar17 - uVar14;
        lVar15 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + uVar14;
        local_70 = pdVar8;
        if (1 < lVar16) {
          lVar13 = uVar14 + 2;
          if ((long)(uVar14 + 2) < lVar15) {
            lVar13 = lVar15;
          }
          memset((void *)((long)pdVar1 + uVar11 * 8 + uVar14 * 8 + lVar3 * local_b0),0,
                 (~uVar14 + lVar13 & 0xfffffffffffffffe) * 8 + 0x10);
        }
        if (lVar15 < (long)uVar17) {
          memset(local_70 + (lVar16 / 2) * 2 + uVar14,0,(lVar16 % 2) * 8);
        }
        lVar12 = lVar12 + 1;
        lVar16 = (local_68->m_vectors->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
        local_b0 = local_b0 + 8;
        lVar10 = lVar10 + -1;
      } while (lVar12 < lVar16 - (long)pdVar2);
    }
  }
  return;
LAB_001297a3:
  pcVar9 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, Level = 0]"
  ;
  local_98 = local_90;
  goto LAB_00129846;
LAB_0012978c:
  pcVar9 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
  ;
  local_98 = local_90;
  goto LAB_00129810;
LAB_00129831:
  pcVar9 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
  ;
  goto LAB_00129846;
LAB_001297dc:
  pcVar9 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>]"
  ;
LAB_001297f1:
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,pcVar9);
LAB_001297fb:
  pcVar9 = 
  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_00129810:
  __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                ,0x8d,pcVar9);
LAB_0012981a:
  pcVar9 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, Level = 0]"
  ;
LAB_00129846:
  __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                ,0x94,pcVar9);
}

Assistant:

void evalTo(Dest& dst, Workspace& workspace) const
    {
      workspace.resize(rows());
      Index vecs = m_length;
      const typename Dest::Scalar *dst_data = internal::extract_data(dst);
      if(    internal::is_same<typename internal::remove_all<VectorsType>::type,Dest>::value
          && dst_data!=0 && dst_data == internal::extract_data(m_vectors))
      {
        // in-place
        dst.diagonal().setOnes();
        dst.template triangularView<StrictlyUpper>().setZero();
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_trans)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), workspace.data());
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), workspace.data());

          // clear the off diagonal vector
          dst.col(k).tail(rows()-k-1).setZero();
        }
        // clear the remaining columns if needed
        for(Index k = 0; k<cols()-vecs ; ++k)
          dst.col(k).tail(rows()-k-1).setZero();
      }
      else
      {
        dst.setIdentity(rows(), rows());
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_trans)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), &workspace.coeffRef(0));
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), &workspace.coeffRef(0));
        }
      }
    }